

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::InternalDeallocate<true>
          (RepeatedField<google::protobuf::UnknownField> *this)

{
  int iVar1;
  HeapRep *pHVar2;
  LogMessageFatal local_20 [16];
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x263,9,"!is_soo()");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
  }
  iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  pHVar2 = heap_rep(this);
  if ((pHVar2->field_0).arena != (Arena *)0x0) {
    return;
  }
  pHVar2 = heap_rep(this);
  operator_delete(pHVar2,(long)iVar1 * 0x10 + 0x10);
  return;
}

Assistant:

bool is_soo() const { return (arena_and_size & kNotSooBit) == 0; }